

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::Image::set_alpha_from_mask_color(Image *this,uint64_t r,uint64_t g,uint64_t b)

{
  uint64_t local_78;
  uint64_t a;
  uint64_t sb;
  uint64_t sg;
  uint64_t sr;
  ssize_t x;
  ssize_t y;
  ssize_t h;
  ssize_t w;
  uint64_t b_local;
  uint64_t g_local;
  uint64_t r_local;
  Image *this_local;
  
  w = b;
  b_local = g;
  g_local = r;
  r_local = (uint64_t)this;
  h = get_width(this);
  y = get_height(this);
  for (x = 0; x < y; x = x + 1) {
    for (sr = 0; (long)sr < h; sr = sr + 1) {
      read_pixel(this,sr,x,&sg,&sb,&a,(uint64_t *)0x0);
      if (((sg == g_local) && (sb == b_local)) && (a == w)) {
        local_78 = 0;
      }
      else {
        local_78 = this->max_value;
      }
      write_pixel(this,sr,x,sg,sb,a,local_78);
    }
  }
  return;
}

Assistant:

void Image::set_alpha_from_mask_color(uint64_t r, uint64_t g, uint64_t b) {
  ssize_t w = this->get_width();
  ssize_t h = this->get_height();
  for (ssize_t y = 0; y < h; y++) {
    for (ssize_t x = 0; x < w; x++) {
      uint64_t sr, sg, sb;
      this->read_pixel(x, y, &sr, &sg, &sb);
      uint64_t a = (sr == r && sg == g && sb == b) ? 0 : this->max_value;
      this->write_pixel(x, y, sr, sg, sb, a);
    }
  }
}